

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRFactory.h
# Opt level: O0

VRGraphicsToolkit * __thiscall
MinVR::VRFactory::create<MinVR::VRGraphicsToolkit>
          (VRFactory *this,VRMainInterface *vrMain,VRDataIndex *config,string *dataContainer)

{
  bool bVar1;
  string *in_stack_00000010;
  int *in_stack_00000018;
  string *in_stack_00000020;
  string *in_stack_00000028;
  string *in_stack_00000030;
  iterator it_1;
  string helpmsg;
  string typeStr;
  VRGraphicsToolkit *item;
  iterator it;
  vector<MinVR::VRItemFactory_*,_std::allocator<MinVR::VRItemFactory_*>_> *in_stack_fffffffffffffdc8
  ;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  VRDataIndex *in_stack_fffffffffffffdd8;
  VRMainInterface *in_stack_fffffffffffffde0;
  VRItemFactory *in_stack_fffffffffffffde8;
  allocator<char> *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  allocator<char> local_1d1;
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_128;
  allocator<char> local_119;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [55];
  allocator<char> local_61;
  string local_60 [32];
  VRGraphicsToolkit *local_40;
  VRItemFactory **local_38;
  __normal_iterator<MinVR::VRItemFactory_**,_std::vector<MinVR::VRItemFactory_*,_std::allocator<MinVR::VRItemFactory_*>_>_>
  local_30 [5];
  VRGraphicsToolkit *local_8;
  
  local_30[0]._M_current =
       (VRItemFactory **)
       std::vector<MinVR::VRItemFactory_*,_std::allocator<MinVR::VRItemFactory_*>_>::begin
                 (in_stack_fffffffffffffdc8);
  while( true ) {
    local_38 = (VRItemFactory **)
               std::vector<MinVR::VRItemFactory_*,_std::allocator<MinVR::VRItemFactory_*>_>::end
                         (in_stack_fffffffffffffdc8);
    bVar1 = __gnu_cxx::operator<
                      ((__normal_iterator<MinVR::VRItemFactory_**,_std::vector<MinVR::VRItemFactory_*,_std::allocator<MinVR::VRItemFactory_*>_>_>
                        *)in_stack_fffffffffffffdd0,
                       (__normal_iterator<MinVR::VRItemFactory_**,_std::vector<MinVR::VRItemFactory_*,_std::allocator<MinVR::VRItemFactory_*>_>_>
                        *)in_stack_fffffffffffffdc8);
    if (!bVar1) {
      std::type_info::name((type_info *)&VRGraphicsToolkit::typeinfo);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      std::allocator<char>::~allocator(&local_61);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0);
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::~string(local_d8);
      std::__cxx11::string::~string(local_f8);
      std::__cxx11::string::~string(local_118);
      std::allocator<char>::~allocator(&local_119);
      local_128._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffdc8);
      while( true ) {
        local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffdc8);
        bVar1 = __gnu_cxx::operator<
                          ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffdd0,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffdc8);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&local_128);
        std::operator+(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0);
        std::__cxx11::string::operator+=(local_98,local_150);
        std::__cxx11::string::~string(local_150);
        std::__cxx11::string::~string(local_170);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_128);
      }
      std::operator+(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      VRError::VRWarning(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
                         in_stack_00000010);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe08);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe07);
      std::__cxx11::string::~string(local_1d0);
      std::allocator<char>::~allocator(&local_1d1);
      std::__cxx11::string::~string(local_190);
      std::__cxx11::string::~string(local_1b0);
      local_8 = (VRGraphicsToolkit *)0x0;
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::~string(local_60);
      return local_8;
    }
    __gnu_cxx::
    __normal_iterator<MinVR::VRItemFactory_**,_std::vector<MinVR::VRItemFactory_*,_std::allocator<MinVR::VRItemFactory_*>_>_>
    ::operator*(local_30);
    local_40 = VRItemFactory::createItem<MinVR::VRGraphicsToolkit>
                         (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                          in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    if (local_40 != (VRGraphicsToolkit *)0x0) break;
    __gnu_cxx::
    __normal_iterator<MinVR::VRItemFactory_**,_std::vector<MinVR::VRItemFactory_*,_std::allocator<MinVR::VRItemFactory_*>_>_>
    ::operator++(local_30);
  }
  return local_40;
}

Assistant:

T* VRFactory::create(VRMainInterface *vrMain, VRDataIndex *config, const std::string &dataContainer) {

  // Run through all the items in the factory trying to generate something of the
  // correct type.
  for (std::vector<VRItemFactory*>::iterator it = _itemFactories.begin();
       it < _itemFactories.end(); ++it) {

    T* item = (*it)->createItem<T>(vrMain, config, dataContainer);
    if (item != NULL) {
      // Success; we have created something.  Return it.
      return item;
    }
  }

  // Issue a warning here, but we assume the caller will issue an error when it
  // gets a NULL back.  We let the caller kill off the process because it has more
  // information with which to make a decent error message.
  std::string typeStr = std::string(typeid(T).name());
  std::string helpmsg = std::string("This might be caused by a typo in your config file where the subtype (inputdeviceType, displaynodeType, etc) is specified.\n") + 
    "Or if " + typeStr + " is provided by a plugin, there might have been a problem loading that plugin.\n" +
    "VRFactory is currently aware of the following types:";
  for (std::vector<std::string>::iterator it = _registeredTypes.begin(); it < _registeredTypes.end(); ++it) {
    helpmsg += "  " + *it + "\n";
  } 
  VRWARNING("VRFactory was unable to create Nothing in the factory catalog with the type (" +
          typeStr + ") and subtype you specified.", helpmsg);

  // Return NULL to indicate failure.
  return NULL;
}